

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::CJoint::Solve(CJoint *this,btScalar dt,btScalar sor)

{
  Body *this_00;
  Body *this_01;
  btVector3 *pbVar1;
  btVector3 *rpos;
  undefined8 uVar2;
  Cluster *pCVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  Impulse *impulse;
  float fVar6;
  float fVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  btVector3 bVar15;
  Impulse i;
  Impulse local_b8;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  btScalar local_68;
  undefined1 local_58 [16];
  btVector3 local_48;
  undefined4 local_38;
  
  impulse = &local_b8;
  this_00 = (this->super_Joint).m_bodies;
  rpos = this->m_rpos;
  local_68 = sor;
  bVar15 = Body::velocity(this_00,rpos);
  local_78._8_4_ = extraout_XMM0_Dc;
  local_78._0_8_ = bVar15.m_floats._0_8_;
  local_78._12_4_ = extraout_XMM0_Dd;
  local_88._8_4_ = in_XMM1_Dc;
  local_88._0_8_ = bVar15.m_floats._8_8_;
  local_88._12_4_ = in_XMM1_Dd;
  this_01 = (this->super_Joint).m_bodies + 1;
  bVar15 = Body::velocity(this_01,this->m_rpos + 1);
  fVar8 = (float)local_78._0_4_ - bVar15.m_floats[0];
  fVar11 = (this->m_normal).m_floats[0];
  fVar13 = (float)local_78._4_4_ - bVar15.m_floats[1];
  fVar14 = (float)local_88._0_4_ - bVar15.m_floats[2];
  uVar2 = *(undefined8 *)((this->m_normal).m_floats + 1);
  fVar6 = (float)uVar2;
  fVar7 = (float)((ulong)uVar2 >> 0x20);
  fVar12 = fVar7 * fVar14 + fVar8 * fVar11 + fVar6 * fVar13;
  local_b8._32_1_ = 1;
  local_b8.m_drift.m_floats[0] = 0.0;
  local_b8.m_drift.m_floats[1] = 0.0;
  local_b8.m_drift.m_floats[2] = 0.0;
  local_b8.m_drift.m_floats[3] = 0.0;
  pbVar1 = &(this->super_Joint).m_drift;
  auVar5 = *(undefined1 (*) [16])pbVar1->m_floats;
  local_b8.m_velocity.m_floats[0] = (btScalar)*(undefined8 *)pbVar1->m_floats;
  fVar9 = auVar5._4_4_;
  fVar10 = auVar5._8_4_;
  if (fVar12 < 0.0) {
    fVar11 = fVar11 * fVar12;
    fVar6 = fVar6 * fVar12;
    fVar7 = fVar7 * fVar12;
    fVar12 = this->m_friction;
    local_b8.m_velocity.m_floats[0] =
         local_b8.m_velocity.m_floats[0] + (fVar8 - fVar11) * fVar12 + fVar11;
    fVar9 = fVar9 + fVar12 * (fVar13 - fVar6) + fVar6;
    fVar10 = fVar10 + fVar12 * (fVar14 - fVar7) + fVar7;
  }
  fVar11 = ((this->super_Joint).m_massmatrix.m_el[2].m_floats[2] * fVar10 +
           (this->super_Joint).m_massmatrix.m_el[2].m_floats[0] * local_b8.m_velocity.m_floats[0] +
           (this->super_Joint).m_massmatrix.m_el[2].m_floats[1] * fVar9) * local_68;
  fVar6 = local_68 *
          ((this->super_Joint).m_massmatrix.m_el[0].m_floats[2] * fVar10 +
          local_b8.m_velocity.m_floats[0] * (this->super_Joint).m_massmatrix.m_el[0].m_floats[0] +
          fVar9 * (this->super_Joint).m_massmatrix.m_el[0].m_floats[1]);
  fVar7 = local_68 *
          ((this->super_Joint).m_massmatrix.m_el[1].m_floats[2] * fVar10 +
          local_b8.m_velocity.m_floats[0] * (this->super_Joint).m_massmatrix.m_el[1].m_floats[0] +
          fVar9 * (this->super_Joint).m_massmatrix.m_el[1].m_floats[1]);
  local_b8.m_velocity.m_floats[2] = fVar11;
  local_b8.m_velocity.m_floats[0] = fVar6;
  local_b8.m_velocity.m_floats[1] = fVar7;
  local_b8.m_velocity.m_floats[3] = 0.0;
  pCVar3 = (this->super_Joint).m_bodies[0].m_soft;
  if (pCVar3 == (this->super_Joint).m_bodies[1].m_soft) {
    if (NAN(fVar6) || NAN(fVar7)) {
      return;
    }
    if (NAN(fVar11)) {
      return;
    }
    if (SQRT(fVar11 * fVar11 + fVar6 * fVar6 + fVar7 * fVar7) < pCVar3->m_maxSelfCollisionImpulse) {
      return;
    }
    fVar8 = pCVar3->m_selfCollisionImpulseFactor;
    local_38 = local_b8._32_4_;
    local_58._4_4_ = fVar8 * -fVar7;
    local_58._0_4_ = fVar8 * -fVar6;
    local_58._8_4_ = -fVar11 * fVar8;
    local_58._12_4_ = 0;
    local_48.m_floats[1] = fVar8 * -0.0;
    local_48.m_floats[0] = local_48.m_floats[1];
    local_48.m_floats[2] = local_48.m_floats[1];
    local_48.m_floats[3] = 0.0;
    Body::applyImpulse(this_00,(Impulse *)local_58,rpos);
    fVar11 = this_00->m_soft->m_selfCollisionImpulseFactor;
    local_38 = local_b8._32_4_;
    local_58._4_4_ = local_b8.m_velocity.m_floats[1] * fVar11;
    local_58._0_4_ = local_b8.m_velocity.m_floats[0] * fVar11;
    local_58._8_4_ = local_b8.m_velocity.m_floats[2];
    local_58._12_4_ = local_b8.m_velocity.m_floats[3];
    local_58._8_4_ = (float)local_58._8_4_ * fVar11;
    local_48.m_floats[1] = local_b8.m_drift.m_floats[1] * fVar11;
    local_48.m_floats[0] = local_b8.m_drift.m_floats[0] * fVar11;
    local_48.m_floats[2] = local_b8.m_drift.m_floats[2];
    local_48.m_floats[3] = local_b8.m_drift.m_floats[3];
    local_48.m_floats[2] = fVar11 * local_48.m_floats[2];
    impulse = (Impulse *)local_58;
  }
  else {
    local_38 = local_b8._32_4_;
    uVar4 = CONCAT44(fVar7,fVar6) ^ 0x8000000080000000;
    local_58._8_4_ = -fVar11;
    local_58._0_4_ = (int)uVar4;
    local_58._4_4_ = (int)(uVar4 >> 0x20);
    local_58._12_4_ = 0.0;
    local_48.m_floats[2] = -0.0;
    local_48.m_floats[0] = -0.0;
    local_48.m_floats[1] = -0.0;
    local_48.m_floats[3] = 0.0;
    Body::applyImpulse(this_00,(Impulse *)local_58,rpos);
  }
  Body::applyImpulse(this_01,impulse,this->m_rpos + 1);
  return;
}

Assistant:

void				btSoftBody::CJoint::Solve(btScalar dt,btScalar sor)
{
	const btVector3		va=m_bodies[0].velocity(m_rpos[0]);
	const btVector3		vb=m_bodies[1].velocity(m_rpos[1]);
	const btVector3		vrel=va-vb;
	const btScalar		rvac=btDot(vrel,m_normal);
	btSoftBody::Impulse	impulse;
	impulse.m_asVelocity	=	1;
	impulse.m_velocity		=	m_drift;
	if(rvac<0)
	{
		const btVector3	iv=m_normal*rvac;
		const btVector3	fv=vrel-iv;
		impulse.m_velocity	+=	iv+fv*m_friction;
	}
	impulse.m_velocity=m_massmatrix*impulse.m_velocity*sor;
	
	if (m_bodies[0].m_soft==m_bodies[1].m_soft)
	{
		if ((impulse.m_velocity.getX() ==impulse.m_velocity.getX())&&(impulse.m_velocity.getY() ==impulse.m_velocity.getY())&&
			(impulse.m_velocity.getZ() ==impulse.m_velocity.getZ()))
		{
			if (impulse.m_asVelocity)
			{
				if (impulse.m_velocity.length() <m_bodies[0].m_soft->m_maxSelfCollisionImpulse)
				{
					
				} else
				{
					m_bodies[0].applyImpulse(-impulse*m_bodies[0].m_soft->m_selfCollisionImpulseFactor,m_rpos[0]);
					m_bodies[1].applyImpulse( impulse*m_bodies[0].m_soft->m_selfCollisionImpulseFactor,m_rpos[1]);
				}
			}
		}
	} else
	{
		m_bodies[0].applyImpulse(-impulse,m_rpos[0]);
		m_bodies[1].applyImpulse( impulse,m_rpos[1]);
	}
}